

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastV32R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  RepeatedField<unsigned_int> *this;
  char *pcVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  uint *puVar8;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  this = (RepeatedField<unsigned_int> *)
         ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) == 0) {
    cVar1 = *ptr;
    do {
      pcVar6 = (char *)(long)*(char *)((long)ptr + 1);
      if ((long)pcVar6 < 0) {
        uVar4 = (long)(char)*(ushort *)((long)ptr + 2) << 7;
        uVar5 = uVar4 | 0x7f;
        if ((long)uVar5 < 0) {
          aVar7.data = (long)*(char *)((long)ptr + 3) << 0xe | 0x3fff;
          if ((long)aVar7 < 0) {
            uVar5 = ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU) & uVar5;
            if ((long)uVar5 < 0) {
              aVar7.data = ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU) & aVar7.data;
              if ((long)aVar7 < 0) {
                if ((char)*(ushort *)((long)ptr + 6) < '\0') {
                  if (*(char *)((long)ptr + 7) < '\0') {
                    if ((char)*(ushort *)((long)ptr + 8) < '\0') {
                      if (*(char *)((long)ptr + 9) < '\0') {
                        cVar2 = (char)*(ushort *)((long)ptr + 10);
                        ptr = (char *)((long)ptr + 0xb);
                        if ((cVar2 != '\x01') && (cVar2 < '\0')) {
                          pcVar6 = Error(msg,pcVar6,
                                         (ParseContext *)CONCAT71((int7)(uVar4 >> 8),cVar2),
                                         (TcFieldData)aVar7,table,hasbits);
                          return pcVar6;
                        }
                      }
                      else {
                        ptr = (char *)((long)ptr + 10);
                      }
                    }
                    else {
                      ptr = (char *)((long)ptr + 9);
                    }
                  }
                  else {
                    ptr = (char *)((long)ptr + 8);
                  }
                }
                else {
                  ptr = (char *)((long)ptr + 7);
                }
              }
              else {
                ptr = (char *)((long)ptr + 6);
              }
            }
            else {
              ptr = (char *)((long)ptr + 5);
            }
          }
          else {
            ptr = (char *)((long)ptr + 4);
          }
          uVar5 = aVar7.data & uVar5;
        }
        else {
          ptr = (char *)((long)ptr + 3);
        }
        pcVar6 = (char *)((ulong)pcVar6 & uVar5);
      }
      else {
        ptr = (char *)((long)ptr + 2);
      }
      RepeatedField<unsigned_int>::Add(this,(uint)pcVar6);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
          if (((ulong)puVar8 & 3) != 0) {
            AlignFail(puVar8);
          }
          *puVar8 = *puVar8 | (uint)hasbits;
        }
        return (char *)(ushort *)ptr;
      }
    } while ((char)*(ushort *)ptr == cVar1);
    uVar3 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar3 & 7) == 0) {
      uVar4 = (ulong)(uVar3 & 0xfffffff8);
      pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                 (msg,ptr,ctx,
                                  (ulong)*(ushort *)ptr ^
                                  *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),table,hasbits);
      return pcVar6;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  AlignFail(this);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV32R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<uint32_t, uint8_t>(
      PROTOBUF_TC_PARAM_PASS);
}